

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

int av1_get_intrabc_extra_top_right_sb_delay(AV1_COMMON *cm)

{
  int iVar1;
  AV1_COMMON *in_RDI;
  int local_4;
  
  iVar1 = av1_allow_intrabc(in_RDI);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    local_4 = 4;
    if (in_RDI->seq_params->sb_size == BLOCK_128X128) {
      local_4 = 2;
    }
  }
  return local_4;
}

Assistant:

int av1_get_intrabc_extra_top_right_sb_delay(const AV1_COMMON *cm) {
  // No additional top-right delay when intraBC tool is not enabled.
  if (!av1_allow_intrabc(cm)) return 0;
  // Due to the hardware constraints on processing the intraBC tool with row
  // multithreading, a top-right delay of 3 superblocks of size 128x128 or 5
  // superblocks of size 64x64 is mandated. However, a minimum top-right delay
  // of 1 superblock is assured with 'sync_range'. Hence return only the
  // additional superblock delay when the intraBC tool is enabled.
  return cm->seq_params->sb_size == BLOCK_128X128 ? 2 : 4;
}